

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O1

XrResult __thiscall
RuntimeInterface::CreateInstance
          (RuntimeInterface *this,XrInstanceCreateInfo *info,XrInstance *instance)

{
  XrGeneratedDispatchTableCore *pXVar1;
  XrResult XVar2;
  int iVar3;
  XrGeneratedDispatchTableCore *table;
  mapped_type *pmVar4;
  PFN_xrCreateInstance rt_xrCreateInstance;
  PFN_xrVoidFunction local_30;
  
  (*this->_get_instance_proc_addr)((XrInstance)0x0,"xrCreateInstance",&local_30);
  XVar2 = (*local_30)(info);
  if (XR_ERROR_VALIDATION_FAILURE < XVar2) {
    table = (XrGeneratedDispatchTableCore *)operator_new(0x1f8);
    memset(table,0,0x1f8);
    GeneratedXrPopulateDispatchTableCore(table,*instance,this->_get_instance_proc_addr);
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->_dispatch_table_mutex);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    pmVar4 = std::__detail::
             _Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<XrInstance_T_*,_std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->_dispatch_table_map,instance);
    pXVar1 = (pmVar4->_M_t).
             super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ._M_t.
             super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
             .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl;
    (pmVar4->_M_t).
    super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
    ._M_t.
    super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
    .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl = table;
    if (pXVar1 != (XrGeneratedDispatchTableCore *)0x0) {
      operator_delete(pXVar1,0x1f8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_dispatch_table_mutex);
  }
  return XVar2;
}

Assistant:

XrResult RuntimeInterface::CreateInstance(const XrInstanceCreateInfo* info, XrInstance* instance) {
    XrResult res = XR_SUCCESS;
    bool create_succeeded = false;
    PFN_xrCreateInstance rt_xrCreateInstance;
    _get_instance_proc_addr(XR_NULL_HANDLE, "xrCreateInstance", reinterpret_cast<PFN_xrVoidFunction*>(&rt_xrCreateInstance));
    res = rt_xrCreateInstance(info, instance);
    if (XR_SUCCEEDED(res)) {
        create_succeeded = true;
        std::unique_ptr<XrGeneratedDispatchTableCore> dispatch_table(new XrGeneratedDispatchTableCore());
        GeneratedXrPopulateDispatchTableCore(dispatch_table.get(), *instance, _get_instance_proc_addr);
        std::lock_guard<std::mutex> mlock(_dispatch_table_mutex);
        _dispatch_table_map[*instance] = std::move(dispatch_table);
    }

    // If the failure occurred during the populate, clean up the instance we had picked up from the runtime
    if (XR_FAILED(res) && create_succeeded) {
        PFN_xrDestroyInstance rt_xrDestroyInstance;
        _get_instance_proc_addr(*instance, "xrDestroyInstance", reinterpret_cast<PFN_xrVoidFunction*>(&rt_xrDestroyInstance));
        rt_xrDestroyInstance(*instance);
        *instance = XR_NULL_HANDLE;
    }

    return res;
}